

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O3

void deqp::gles3::Functional::translateState
               (RenderState *src,FragmentOperationState *dst,RenderTarget *renderTarget)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TestFunc TVar7;
  uint uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  
  iVar2 = renderTarget->m_depthBits;
  uVar9 = 0;
  uVar8 = 0;
  iVar3 = renderTarget->m_stencilBits;
  dst->scissorTestEnabled = src->scissorTestEnabled;
  iVar4 = (src->scissorRectangle).bottom;
  iVar5 = (src->scissorRectangle).width;
  iVar6 = (src->scissorRectangle).height;
  (dst->scissorRectangle).left = (src->scissorRectangle).left;
  (dst->scissorRectangle).bottom = iVar4;
  (dst->scissorRectangle).width = iVar5;
  (dst->scissorRectangle).height = iVar6;
  if (0 < iVar3) {
    uVar8 = *(uint *)&src->stencilTestEnabled;
  }
  dst->stencilTestEnabled = SUB41(uVar8,0);
  if (0 < iVar2) {
    uVar9 = *(uint *)&src->depthTestEnabled;
  }
  dst->depthTestEnabled = SUB41(uVar9,0);
  dst->blendMode = (uint)src->blendEnabled;
  dst->numStencilBits = renderTarget->m_stencilBits;
  *(undefined4 *)(dst->colorMask).m_data = *(undefined4 *)(src->colorMask).m_data;
  if ((uVar9 & 1) != 0) {
    TVar7 = sglr::rr_util::mapGLTestFunc(src->depthFunc);
    dst->depthFunc = TVar7;
    dst->depthMask = src->depthWriteMask;
    uVar8 = (uint)dst->stencilTestEnabled;
  }
  if ((uVar8 & 1) != 0) {
    translateStencilState(src->stencil + 1,dst->stencilStates + 1);
    translateStencilState(src->stencil,dst->stencilStates);
  }
  if (src->blendEnabled == true) {
    translateBlendState(&src->blendRGBState,&dst->blendRGBState);
    translateBlendState(&src->blendAState,&dst->blendAState);
    auVar1 = *(undefined1 (*) [16])(src->blendColor).m_data;
    auVar10 = minps(_DAT_01a1c5b0,auVar1);
    (dst->blendColor).m_data[0] = (float)(-(uint)(0.0 <= auVar1._0_4_) & auVar10._0_4_);
    (dst->blendColor).m_data[1] = (float)(-(uint)(0.0 <= auVar1._4_4_) & auVar10._4_4_);
    (dst->blendColor).m_data[2] = (float)(-(uint)(0.0 <= auVar1._8_4_) & auVar10._8_4_);
    (dst->blendColor).m_data[3] = (float)(-(uint)(0.0 <= auVar1._12_4_) & auVar10._12_4_);
  }
  return;
}

Assistant:

void translateState (const RenderState& src, rr::FragmentOperationState& dst, const tcu::RenderTarget& renderTarget)
{
	bool hasDepth		= renderTarget.getDepthBits() > 0;
	bool hasStencil		= renderTarget.getStencilBits() > 0;

	dst.scissorTestEnabled		= src.scissorTestEnabled;
	dst.scissorRectangle		= src.scissorRectangle;
	dst.stencilTestEnabled		= hasStencil && src.stencilTestEnabled;
	dst.depthTestEnabled		= hasDepth && src.depthTestEnabled;
	dst.blendMode				= src.blendEnabled ? rr::BLENDMODE_STANDARD : rr::BLENDMODE_NONE;
	dst.numStencilBits			= renderTarget.getStencilBits();

	dst.colorMask = src.colorMask;

	if (dst.depthTestEnabled)
	{
		dst.depthFunc	= sglr::rr_util::mapGLTestFunc(src.depthFunc);
		dst.depthMask	= src.depthWriteMask;
	}

	if (dst.stencilTestEnabled)
	{
		translateStencilState(src.stencil[rr::FACETYPE_BACK],	dst.stencilStates[rr::FACETYPE_BACK]);
		translateStencilState(src.stencil[rr::FACETYPE_FRONT],	dst.stencilStates[rr::FACETYPE_FRONT]);
	}

	if (src.blendEnabled)
	{
		translateBlendState(src.blendRGBState, dst.blendRGBState);
		translateBlendState(src.blendAState, dst.blendAState);
		dst.blendColor = tcu::clamp(src.blendColor, Vec4(0.0f), Vec4(1.0f));
	}
}